

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)

{
  bool bVar1;
  int iVar2;
  QAnimationTimer *animation_00;
  QAbstractAnimationPrivate *pQVar3;
  qsizetype qVar4;
  QListSpecialMethodsBase<QAbstractAnimation_*> *in_RDI;
  long in_FS_OFFSET;
  int idx;
  QAnimationTimer *inst;
  QAbstractAnimation **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  QObject *obj;
  
  obj = *(QObject **)(in_FS_OFFSET + 0x28);
  animation_00 = instance(SUB81((ulong)in_RDI >> 0x38,0));
  if (animation_00 != (QAnimationTimer *)0x0) {
    unregisterRunningAnimation
              ((QAnimationTimer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (QAbstractAnimation *)animation_00);
    pQVar3 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x66a30c);
    if ((pQVar3->hasRegisteredTimer & 1U) == 0) goto LAB_0066a3d1;
    qVar4 = QListSpecialMethodsBase<QAbstractAnimation*>::indexOf<QAbstractAnimation*>
                      (in_RDI,(QAbstractAnimation **)animation_00,
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    iVar2 = (int)qVar4;
    if (iVar2 == -1) {
      QList<QAbstractAnimation*>::removeOne<QAbstractAnimation*>
                ((QList<QAbstractAnimation_*> *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8);
    }
    else {
      QList<QAbstractAnimation_*>::removeAt
                ((QList<QAbstractAnimation_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 (qsizetype)in_stack_ffffffffffffffd8);
      if (iVar2 <= animation_00->currentAnimationIdx) {
        animation_00->currentAnimationIdx = animation_00->currentAnimationIdx + -1;
      }
      bVar1 = QList<QAbstractAnimation_*>::isEmpty((QList<QAbstractAnimation_*> *)0x66a379);
      if ((bVar1) && ((animation_00->stopTimerPending & 1U) == 0)) {
        animation_00->stopTimerPending = true;
        QMetaObject::invokeMethod<>
                  (obj,(char *)in_RDI,(ConnectionType)((ulong)animation_00 >> 0x20));
      }
    }
  }
  pQVar3 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x66a3ca);
  pQVar3->hasRegisteredTimer = false;
LAB_0066a3d1:
  if (*(QObject **)(in_FS_OFFSET + 0x28) != obj) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)
{
    QAnimationTimer *inst = QAnimationTimer::instance(false);
    if (inst) {
        //at this point the unified timer should have been created
        //but it might also have been already destroyed in case the application is shutting down

        inst->unregisterRunningAnimation(animation);

        if (!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer)
            return;

        int idx = inst->animations.indexOf(animation);
        if (idx != -1) {
            inst->animations.removeAt(idx);
            // this is needed if we unregister an animation while its running
            if (idx <= inst->currentAnimationIdx)
                --inst->currentAnimationIdx;

            if (inst->animations.isEmpty() && !inst->stopTimerPending) {
                inst->stopTimerPending = true;
                QMetaObject::invokeMethod(inst, "stopTimer", Qt::QueuedConnection);
            }
        } else {
            inst->animationsToStart.removeOne(animation);
        }
    }
    QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = false;
}